

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

MeasureUnit * icu_63::MeasureUnit::createArcMinute(UErrorCode *status)

{
  MeasureUnit *pMVar1;
  size_t in_RSI;
  
  if (U_ZERO_ERROR < *status) {
    return (MeasureUnit *)0x0;
  }
  pMVar1 = (MeasureUnit *)UMemory::operator_new((UMemory *)0x18,in_RSI);
  if (pMVar1 == (MeasureUnit *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    pMVar1 = (MeasureUnit *)0x0;
  }
  else {
    (pMVar1->super_UObject)._vptr_UObject = (_func_int **)&PTR__MeasureUnit_003a7270;
    pMVar1->fTypeId = 1;
    pMVar1->fSubTypeId = 0;
    pMVar1->fCurrency[0] = '\0';
  }
  return pMVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }